

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-metadce.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  IString IVar2;
  IString x;
  IString x_00;
  IString x_01;
  char cVar3;
  bool bVar4;
  string *psVar5;
  mapped_type *pmVar6;
  char *curr;
  size_t sVar7;
  __shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *p_Var8;
  Ref *pRVar9;
  IString *pIVar10;
  size_t sVar11;
  string_view *psVar12;
  bool *pbVar13;
  mapped_type *pmVar14;
  mapped_type *this;
  size_type sVar15;
  ostream *poVar16;
  size_t sVar17;
  key_type *__x;
  size_t sVar18;
  undefined1 local_c78 [8];
  ToolOptions options;
  Module wasm;
  MetaDCEGraph graph;
  _Any_data local_4f8;
  code *local_4e8;
  code *local_4e0;
  _Any_data local_4d8;
  code *local_4c8;
  code *local_4c0;
  string local_4b0 [32];
  string local_490 [32];
  string local_470 [32];
  string local_450 [32];
  string local_430 [32];
  string local_410 [32];
  string local_3f0 [32];
  undefined1 uStack_3d0;
  undefined1 auStack_3cf [7];
  ImportId id;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  _Alloc_hider local_3a8;
  size_type local_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  _Alloc_hider local_388;
  size_type local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378 [19];
  undefined1 auStack_248 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  passes;
  string graphFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input;
  Ref name;
  string local_1d0 [8];
  string WasmMetaDCEOption;
  IString NAME;
  undefined1 local_190 [8];
  IString IMPORT;
  char *local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> graphInput;
  IString REACHES;
  undefined1 local_118 [8];
  IString ROOT;
  undefined1 local_f8 [8];
  IString EXPORT;
  undefined1 local_d8 [8];
  Value outside;
  undefined1 local_b8 [8];
  Ref ref;
  undefined1 auStack_98 [8];
  DCENode node;
  undefined1 local_68 [8];
  Ref reaches;
  allocator<char> local_43;
  allocator<char> local_42;
  allocator<char> local_41;
  allocator<char> local_40;
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d;
  allocator<char> local_3c;
  allocator<char> local_3b;
  allocator<char> local_3a;
  allocator<char> local_39;
  allocator<char> local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35;
  allocator<char> local_34;
  undefined1 local_33;
  char local_32;
  bool local_31 [6];
  bool emitBinary;
  bool dump;
  bool debugInfo;
  
  passes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_248 = (undefined1  [8])0x0;
  passes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_33 = 1;
  passes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&graphFile._M_string_length;
  graphFile._M_dataplus._M_p = (pointer)0x0;
  local_31[0] = false;
  graphFile._M_string_length._0_1_ = 0;
  local_32 = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d0,"wasm-opt options",(allocator<char> *)&options.enabledFeatures);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&options.enabledFeatures,"wasm-metadce",(allocator<char> *)&uStack_3d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&wasm.tagsMap._M_h._M_single_bucket,
             "This tool performs dead code elimination (DCE) on a larger space that the wasm module is just a part of. For example, if you have JS and wasm that are connected, this can DCE the combined graph. By doing so, it is able to eliminate wasm module exports, which otherwise regular optimizations cannot.\n\nThis tool receives a representation of the reachability graph that the wasm module resides in, which contains abstract nodes and connections showing what they reach. Some of those nodes can represent the wasm module\'s imports and exports. The tool then completes the graph by adding the internal parts of the module, and does DCE on the entire thing.\n\nThis tool will output a wasm module with dead code eliminated, and metadata describing the things in the rest of the graph that can be eliminated as well.\n\nThe graph description file should represent the graph in the following JSON-like notation (note, this is not true JSON, things like comments, escaping, single-quotes, etc. are not supported):\n\n  [\n    {\n      \"name\": \"entity1\",\n      \"reaches\": [\"entity2, \"entity3\"],\n      \"root\": true\n    },\n    {\n      \"name\": \"entity2\",\n      \"reaches\": [\"entity1, \"entity4\"]\n    },\n    {\n      \"name\": \"entity3\",\n      \"reaches\": [\"entity1\"],\n      \"export\": \"export1\"\n    },\n    {\n      \"name\": \"entity4\",\n      \"import\": [\"module\", \"import1\"]\n    },\n  ]\n\nEach entity has a name and an optional list of the other entities it reaches. It can also be marked as a root, export (with the export string), or import (with the module and import strings). DCE then computes what is reachable from the roots."
             ,(allocator<char> *)auStack_98);
  ::wasm::ToolOptions::ToolOptions
            ((ToolOptions *)local_c78,(string *)&options.enabledFeatures,
             (string *)&wasm.tagsMap._M_h._M_single_bucket);
  std::__cxx11::string::~string((string *)&wasm.tagsMap._M_h._M_single_bucket);
  std::__cxx11::string::~string((string *)&options.enabledFeatures);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&options.enabledFeatures,"--output",&local_43);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&wasm.tagsMap._M_h._M_single_bucket,"-o",&local_42);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&uStack_3d0,"Output file (stdout if not specified)",&local_41);
  auStack_98 = (undefined1  [8])0x0;
  node.name.super_IString.str._M_len = 0;
  node.reaches.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-metadce.cpp:480:10)>
                ::_M_invoke;
  node.name.super_IString.str._M_str =
       (char *)std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-metadce.cpp:480:10)>
               ::_M_manager;
  psVar5 = (string *)
           ::wasm::Options::add
                     ((string *)local_c78,(string *)&options.enabledFeatures,
                      (string *)&wasm.tagsMap._M_h._M_single_bucket,(string *)&uStack_3d0,
                      (Arguments)local_1d0,(function *)0x1,SUB81((allocator<char> *)auStack_98,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(graphFile.field_2._M_local_buf + 8),"--emit-text",&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"-S",&local_3f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d8,"Emit text instead of binary for the output file",&local_3e);
  WasmMetaDCEOption.field_2._8_8_ = &local_33;
  psVar5 = (string *)
           ::wasm::Options::add
                     (psVar5,(string *)(graphFile.field_2._M_local_buf + 8),(string *)&local_158,
                      (string *)local_d8,(Arguments)local_1d0,(function *)0x0,
                      (bool)((char)&WasmMetaDCEOption + '\x18'));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(graphInput.field_2._M_local_buf + 8),"--debuginfo",&local_3d);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_118,"-g",&local_3c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f8,"Emit names section and debug info",&local_3b);
  IMPORT.str._M_len = 0;
  local_190 = (undefined1  [8])local_31;
  IMPORT.str._M_str =
       (char *)std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-metadce.cpp:495:10)>
               ::_M_manager;
  psVar5 = (string *)
           ::wasm::Options::add
                     (psVar5,(string *)(graphInput.field_2._M_local_buf + 8),(string *)local_118,
                      (string *)local_f8,(Arguments)local_1d0,(function *)0x0,SUB81(local_190,0));
  std::__cxx11::string::string<std::allocator<char>>((string *)local_b8,"--graph-file",&local_3a);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,"-f",&local_39);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input.field_2._M_local_buf + 8),"Filename of the graph description file",
             &local_38);
  graph.reached._M_h._M_single_bucket =
       (__node_base_ptr)
       &passes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  psVar5 = (string *)
           ::wasm::Options::add
                     (psVar5,(string *)local_b8,(string *)local_68,
                      (string *)(input.field_2._M_local_buf + 8),(Arguments)local_1d0,
                      (function *)0x1,(bool)((char)&graph + -0x58));
  std::__cxx11::string::string<std::allocator<char>>(local_4b0,"--dump",&local_37);
  std::__cxx11::string::string<std::allocator<char>>(local_490,"-d",&local_36);
  std::__cxx11::string::string<std::allocator<char>>
            (local_470,"Dump the combined graph file (useful for debugging)",&local_35);
  local_4f8._8_8_ = 0;
  local_4f8._M_unused._M_object = &local_32;
  local_4e0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-metadce.cpp:507:10)>
              ::_M_invoke;
  local_4e8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-metadce.cpp:507:10)>
              ::_M_manager;
  psVar5 = (string *)
           ::wasm::Options::add
                     (psVar5,local_4b0,local_490,local_470,(Arguments)local_1d0,(function *)0x0,
                      SUB81(&local_4f8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_450,"INFILE",&local_34);
  local_4d8._M_unused._M_object = (void *)0x0;
  local_4d8._8_8_ = 0;
  local_4c0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-metadce.cpp:510:21)>
              ::_M_invoke;
  local_4c8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-metadce.cpp:510:21)>
              ::_M_manager;
  ::wasm::Options::add_positional(psVar5,(Arguments)local_450,(function *)0x1);
  std::_Function_base::~_Function_base((_Function_base *)&local_4d8);
  std::__cxx11::string::~string(local_450);
  std::_Function_base::~_Function_base((_Function_base *)&local_4f8);
  std::__cxx11::string::~string(local_470);
  std::__cxx11::string::~string(local_490);
  std::__cxx11::string::~string(local_4b0);
  std::_Function_base::~_Function_base((_Function_base *)&graph.reached._M_h._M_single_bucket);
  std::__cxx11::string::~string((string *)(input.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_b8);
  std::_Function_base::~_Function_base((_Function_base *)local_190);
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)(graphInput.field_2._M_local_buf + 8));
  std::_Function_base::~_Function_base((_Function_base *)((long)&WasmMetaDCEOption.field_2 + 8));
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)(graphFile.field_2._M_local_buf + 8));
  std::_Function_base::~_Function_base((_Function_base *)auStack_98);
  std::__cxx11::string::~string((string *)&uStack_3d0);
  std::__cxx11::string::~string((string *)&wasm.tagsMap._M_h._M_single_bucket);
  std::__cxx11::string::~string((string *)&options.enabledFeatures);
  ::wasm::Options::parse((int)local_c78,(char **)(ulong)(uint)argc);
  if (graphFile._M_dataplus._M_p == (pointer)0x0) {
    ::wasm::Fatal::Fatal((Fatal *)&options.enabledFeatures);
    ::wasm::Fatal::operator<<
              ((Fatal *)&options.enabledFeatures,(char (*) [24])"no graph file provided.");
    ::wasm::Fatal::~Fatal((Fatal *)&options.enabledFeatures);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&options.enabledFeatures,"infile",
             (allocator<char> *)&wasm.tagsMap._M_h._M_single_bucket);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&options,(key_type *)&options.enabledFeatures);
  ::wasm::read_file<std::__cxx11::string>
            ((string *)(graphFile.field_2._M_local_buf + 8),(BinaryOption)pmVar6);
  std::__cxx11::string::~string((string *)&options.enabledFeatures);
  ::wasm::Module::Module((Module *)&options.enabledFeatures);
  ::wasm::ToolOptions::applyFeatures((ToolOptions *)local_c78,(Module *)&options.enabledFeatures);
  if (local_c78[0] == (Options)0x1) {
    std::operator<<((ostream *)&std::cerr,"reading...\n");
  }
  stack0xfffffffffffffc34 = 0;
  auStack_3cf[0] = local_31[0];
  uStack_3d0 = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&wasm.tagsMap._M_h._M_single_bucket,"infile",(allocator<char> *)auStack_98);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&options,(key_type *)&wasm.tagsMap._M_h._M_single_bucket);
  std::__cxx11::string::string(local_430,(string *)pmVar6);
  std::__cxx11::string::string<std::allocator<char>>(local_410,"",(allocator<char> *)&local_158);
  ::wasm::ModuleReader::read(&uStack_3d0,local_430,&options.enabledFeatures,local_410);
  std::__cxx11::string::~string(local_410);
  std::__cxx11::string::~string(local_430);
  std::__cxx11::string::~string((string *)&wasm.tagsMap._M_h._M_single_bucket);
  if (options._169_1_ != '\0') {
    cVar3 = ::wasm::WasmValidator::validate
                      ((Module *)&wasm.tagsMap._M_h._M_single_bucket,(int)&options + 0x160);
    if (cVar3 == '\0') {
      poVar16 = (ostream *)std::operator<<((ostream *)&std::cout,(Module *)&options.enabledFeatures)
      ;
      std::operator<<(poVar16,'\n');
      ::wasm::Fatal::Fatal((Fatal *)&wasm.tagsMap._M_h._M_single_bucket);
      ::wasm::Fatal::operator<<
                ((Fatal *)&wasm.tagsMap._M_h._M_single_bucket,
                 (char (*) [26])"error in validating input");
      ::wasm::Fatal::~Fatal((Fatal *)&wasm.tagsMap._M_h._M_single_bucket);
    }
  }
  ::wasm::read_file<std::__cxx11::string>((string *)&local_158,(int)&passes + 0x10);
  curr = strdup(local_158);
  local_d8._0_4_ = Null;
  outside.type = String;
  outside._4_4_ = 0;
  json::Value::parse((Value *)local_d8,curr);
  ::wasm::IString::IString((IString *)((long)&WasmMetaDCEOption.field_2 + 8),"name");
  ::wasm::IString::IString((IString *)((long)&graphInput.field_2 + 8),"reaches");
  ::wasm::IString::IString((IString *)local_118,"root");
  ::wasm::IString::IString((IString *)local_f8,"export");
  ::wasm::IString::IString((IString *)local_190,"import");
  MetaDCEGraph::MetaDCEGraph
            ((MetaDCEGraph *)&wasm.tagsMap._M_h._M_single_bucket,(Module *)&options.enabledFeatures)
  ;
  if (local_d8._0_4_ == Array) {
    sVar7 = json::Value::size((Value *)local_d8);
    sVar17 = 0;
    do {
      if (sVar17 == sVar7) {
        MetaDCEGraph::scanWebAssembly((MetaDCEGraph *)&wasm.tagsMap._M_h._M_single_bucket);
        if (local_32 == '\x01') {
          MetaDCEGraph::dump((MetaDCEGraph *)&wasm.tagsMap._M_h._M_single_bucket);
        }
        MetaDCEGraph::deadCodeElimination((MetaDCEGraph *)&wasm.tagsMap._M_h._M_single_bucket);
        MetaDCEGraph::apply((MetaDCEGraph *)&wasm.tagsMap._M_h._M_single_bucket);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&uStack_3d0,"output",(allocator<char> *)auStack_98);
        __x = (key_type *)&uStack_3d0;
        sVar15 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&options,__x);
        std::__cxx11::string::~string((string *)&uStack_3d0);
        if (sVar15 != 0) {
          _uStack_3d0 = (pointer)(uStack_3d0._3_8_ << 0x18);
          id.super_IString.str._M_len = (size_t)&local_3b8;
          id.super_IString.str._M_str = (char *)0x0;
          local_3b8._M_local_buf[0] = '\0';
          local_3a8._M_p = (pointer)&local_398;
          local_3a0 = 0;
          local_398._M_local_buf[0] = '\0';
          local_388._M_p = (pointer)local_378;
          local_380 = 0;
          local_378[0]._M_local_buf[0] = '\0';
          auStack_3cf[0] = local_33;
          uStack_3d0 = local_31[0];
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)auStack_98,"output",(allocator<char> *)local_b8);
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&options,(key_type *)auStack_98);
          std::__cxx11::string::string(local_3f0,(string *)pmVar6);
          __x = (key_type *)&options.enabledFeatures;
          ::wasm::ModuleWriter::write(&uStack_3d0,__x,local_3f0);
          std::__cxx11::string::~string(local_3f0);
          std::__cxx11::string::~string((string *)auStack_98);
          ::wasm::ModuleWriter::~ModuleWriter((ModuleWriter *)&uStack_3d0);
        }
        MetaDCEGraph::printAllUnused((MetaDCEGraph *)&wasm.tagsMap._M_h._M_single_bucket);
        free(curr);
        MetaDCEGraph::~MetaDCEGraph((MetaDCEGraph *)&wasm.tagsMap._M_h._M_single_bucket);
        json::Value::free((Value *)local_d8,__x);
        std::__cxx11::string::~string((string *)&local_158);
        ::wasm::Module::~Module((Module *)&options.enabledFeatures);
        std::__cxx11::string::~string((string *)(graphFile.field_2._M_local_buf + 8));
        ::wasm::ToolOptions::~ToolOptions((ToolOptions *)local_c78);
        std::__cxx11::string::~string(local_1d0);
        std::__cxx11::string::~string
                  ((string *)
                   &passes.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_248);
        return 0;
      }
      p_Var8 = (__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *)
               json::Value::operator[]((Value *)local_d8,(uint)sVar17);
      std::__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *)local_b8,p_Var8);
      if (*(Type *)local_b8 != Object) {
        ::wasm::Fatal::Fatal((Fatal *)&uStack_3d0);
        ::wasm::Fatal::operator<<
                  ((Fatal *)&uStack_3d0,
                   (char (*) [67])
                   "nodes in input graph must be JSON objects. see --help for the form");
        goto LAB_00115877;
      }
      IVar2.str._M_str = (char *)0x0;
      IVar2.str._M_len = WasmMetaDCEOption.field_2._8_8_;
      bVar4 = json::Value::has((Value *)local_b8,IVar2);
      if (!bVar4) {
        ::wasm::Fatal::Fatal((Fatal *)&uStack_3d0);
        ::wasm::Fatal::operator<<
                  ((Fatal *)&uStack_3d0,
                   (char (*) [63])"nodes in input graph must have a name. see --help for the form");
        goto LAB_00115877;
      }
      x.str._M_str = (char *)0x0;
      x.str._M_len = WasmMetaDCEOption.field_2._8_8_;
      pRVar9 = json::Value::operator[]((Value *)local_b8,x);
      pIVar10 = json::Value::getIString
                          ((pRVar9->super_shared_ptr<json::Value>).
                           super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      auStack_98 = (undefined1  [8])(pIVar10->str)._M_len;
      node.name.super_IString.str._M_len = (size_t)(pIVar10->str)._M_str;
      node.reaches.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      node.name.super_IString.str._M_str = (char *)0x0;
      node.reaches.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      bVar4 = json::Value::has((Value *)local_b8,(IString)stack0xfffffffffffffec8);
      if (bVar4) {
        p_Var8 = (__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *)
                 json::Value::operator[]((Value *)local_b8,(IString)stack0xfffffffffffffec8);
        std::__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *)local_68,p_Var8);
        if (*(Type *)local_68 != Array) {
          ::wasm::Fatal::Fatal((Fatal *)&uStack_3d0);
          ::wasm::Fatal::operator<<
                    ((Fatal *)&uStack_3d0,
                     (char (*) [55])"node.reaches must be an array. see --help for the form");
          goto LAB_00115877;
        }
        sVar11 = json::Value::size((Value *)local_68);
        for (sVar18 = 0; sVar11 != sVar18; sVar18 = sVar18 + 1) {
          p_Var8 = (__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *)
                   json::Value::operator[]((Value *)local_68,(uint)sVar18);
          std::__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&input.field_2 + 8),p_Var8);
          if (*(int *)input.field_2._8_8_ != 0) {
            ::wasm::Fatal::Fatal((Fatal *)&uStack_3d0);
            ::wasm::Fatal::operator<<
                      ((Fatal *)&uStack_3d0,
                       (char (*) [60])"node.reaches items must be strings. see --help for the form")
            ;
            goto LAB_00115877;
          }
          psVar12 = &json::Value::getIString((Value *)input.field_2._8_8_)->str;
          _uStack_3d0 = *psVar12;
          std::vector<wasm::Name,_std::allocator<wasm::Name>_>::emplace_back<wasm::Name>
                    ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                     &node.name.super_IString.str._M_str,(Name *)&uStack_3d0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&name);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&reaches);
      }
      bVar4 = json::Value::has((Value *)local_b8,(IString)_local_118);
      if (bVar4) {
        p_Var8 = (__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *)
                 json::Value::operator[]((Value *)local_b8,(IString)_local_118);
        std::__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *)local_68,p_Var8);
        if (*(Type *)local_68 == Bool) {
          pbVar13 = json::Value::getBool((Value *)local_68);
          if (*pbVar13 != false) {
            std::__detail::
            _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      *)&graph.nodes._M_h._M_single_bucket,(value_type *)auStack_98);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&reaches);
            goto LAB_00114fd7;
          }
        }
        ::wasm::Fatal::Fatal((Fatal *)&uStack_3d0);
        ::wasm::Fatal::operator<<
                  ((Fatal *)&uStack_3d0,
                   (char (*) [63])"node.root, if it exists, must be true. see --help for the form");
        goto LAB_00115877;
      }
LAB_00114fd7:
      bVar4 = json::Value::has((Value *)local_b8,(IString)_local_f8);
      if (bVar4) {
        p_Var8 = (__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *)
                 json::Value::operator[]((Value *)local_b8,(IString)_local_f8);
        std::__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *)local_68,p_Var8);
        if (*(Type *)local_68 != String) {
          ::wasm::Fatal::Fatal((Fatal *)&uStack_3d0);
          ::wasm::Fatal::operator<<
                    ((Fatal *)&uStack_3d0,
                     (char (*) [69])
                     "node.export, if it exists, must be a string. see --help for the form");
          goto LAB_00115877;
        }
        psVar12 = &json::Value::getIString((Value *)local_68)->str;
        _uStack_3d0 = *psVar12;
        pmVar14 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&graph.roots._M_h._M_single_bucket,(Name *)&uStack_3d0);
        (pmVar14->super_IString).str._M_len = (size_t)auStack_98;
        (pmVar14->super_IString).str._M_str = (char *)node.name.super_IString.str._M_len;
        pIVar10 = json::Value::getIString((Value *)local_68);
        sVar11 = (pIVar10->str)._M_len;
        pcVar1 = (pIVar10->str)._M_str;
        pmVar14 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&graph.tagToDCENode._M_h._M_single_bucket,(key_type *)auStack_98);
        (pmVar14->super_IString).str._M_len = sVar11;
        (pmVar14->super_IString).str._M_str = pcVar1;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&reaches);
      }
      x_00.str._M_str = (char *)IMPORT.str._M_len;
      x_00.str._M_len = (size_t)local_190;
      bVar4 = json::Value::has((Value *)local_b8,x_00);
      if (bVar4) {
        x_01.str._M_str = (char *)IMPORT.str._M_len;
        x_01.str._M_len = (size_t)local_190;
        p_Var8 = (__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *)
                 json::Value::operator[]((Value *)local_b8,x_01);
        std::__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *)local_68,p_Var8);
        if (*(Type *)local_68 == Array) {
          sVar11 = json::Value::size((Value *)local_68);
          if (sVar11 == 2) {
            pRVar9 = json::Value::operator[]((Value *)local_68,0);
            if (((pRVar9->super_shared_ptr<json::Value>).
                 super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type == String
               ) {
              pRVar9 = json::Value::operator[]((Value *)local_68,1);
              if (((pRVar9->super_shared_ptr<json::Value>).
                   super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type ==
                  String) {
                pRVar9 = json::Value::operator[]((Value *)local_68,0);
                psVar12 = &json::Value::getIString
                                     ((pRVar9->super_shared_ptr<json::Value>).
                                      super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_ptr)->str;
                IVar2.str = *psVar12;
                pRVar9 = json::Value::operator[]((Value *)local_68,1);
                psVar12 = &json::Value::getIString
                                     ((pRVar9->super_shared_ptr<json::Value>).
                                      super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_ptr)->str;
                _uStack_3d0 = (string_view)
                              MetaDCEGraph::getImportId
                                        ((MetaDCEGraph *)&wasm.tagsMap._M_h._M_single_bucket,
                                         IVar2.str,(Name)*psVar12);
                pmVar14 = std::__detail::
                          _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)&graph.DCENodeToTag._M_h._M_single_bucket,
                                       (Name *)&uStack_3d0);
                (pmVar14->super_IString).str._M_len = (size_t)auStack_98;
                (pmVar14->super_IString).str._M_str = (char *)node.name.super_IString.str._M_len;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&reaches);
                goto LAB_00115191;
              }
            }
          }
        }
        ::wasm::Fatal::Fatal((Fatal *)&uStack_3d0);
        ::wasm::Fatal::operator<<
                  ((Fatal *)&uStack_3d0,
                   (char (*) [84])
                   "node.import, if it exists, must be an array of two strings. see --help for the form"
                  );
        goto LAB_00115877;
      }
LAB_00115191:
      this = std::__detail::
             _Map_base<wasm::Name,_std::pair<const_wasm::Name,_DCENode>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_DCENode>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&wasm.tagsMap._M_h._M_single_bucket,(key_type *)auStack_98);
      DCENode::operator=(this,(DCENode *)auStack_98);
      std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
                ((_Vector_base<wasm::Name,_std::allocator<wasm::Name>_> *)
                 &node.name.super_IString.str._M_str);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ref);
      sVar17 = sVar17 + 1;
    } while( true );
  }
  ::wasm::Fatal::Fatal((Fatal *)&uStack_3d0);
  ::wasm::Fatal::operator<<
            ((Fatal *)&uStack_3d0,
             (char (*) [67])"input graph must be a JSON array of nodes. see --help for the form");
LAB_00115877:
  ::wasm::Fatal::~Fatal((Fatal *)&uStack_3d0);
}

Assistant:

int main(int argc, const char* argv[]) {
  Name entry;
  std::vector<std::string> passes;
  bool emitBinary = true;
  bool debugInfo = false;
  std::string graphFile;
  bool dump = false;

  const std::string WasmMetaDCEOption = "wasm-opt options";

  ToolOptions options(
    "wasm-metadce",
    "This tool performs dead code elimination (DCE) on a larger space "
    "that the wasm module is just a part of. For example, if you have "
    "JS and wasm that are connected, this can DCE the combined graph. "
    "By doing so, it is able to eliminate wasm module exports, which "
    "otherwise regular optimizations cannot.\n\n"
    "This tool receives a representation of the reachability graph "
    "that the wasm module resides in, which contains abstract nodes "
    "and connections showing what they reach. Some of those nodes "
    "can represent the wasm module's imports and exports. The tool "
    "then completes the graph by adding the internal parts of the "
    "module, and does DCE on the entire thing.\n\n"
    "This tool will output a wasm module with dead code eliminated, "
    "and metadata describing the things in the rest of the graph "
    "that can be eliminated as well.\n\n"
    "The graph description file should represent the graph in the following "
    "JSON-like notation (note, this is not true JSON, things like "
    "comments, escaping, single-quotes, etc. are not supported):\n\n"
    "  [\n"
    "    {\n"
    "      \"name\": \"entity1\",\n"
    "      \"reaches\": [\"entity2, \"entity3\"],\n"
    "      \"root\": true\n"
    "    },\n"
    "    {\n"
    "      \"name\": \"entity2\",\n"
    "      \"reaches\": [\"entity1, \"entity4\"]\n"
    "    },\n"
    "    {\n"
    "      \"name\": \"entity3\",\n"
    "      \"reaches\": [\"entity1\"],\n"
    "      \"export\": \"export1\"\n"
    "    },\n"
    "    {\n"
    "      \"name\": \"entity4\",\n"
    "      \"import\": [\"module\", \"import1\"]\n"
    "    },\n"
    "  ]\n\n"
    "Each entity has a name and an optional list of the other "
    "entities it reaches. It can also be marked as a root, "
    "export (with the export string), or import (with the "
    "module and import strings). DCE then computes what is "
    "reachable from the roots.");

  options
    .add("--output",
         "-o",
         "Output file (stdout if not specified)",
         WasmMetaDCEOption,
         Options::Arguments::One,
         [](Options* o, const std::string& argument) {
           o->extra["output"] = argument;
           Colors::setEnabled(false);
         })
    .add("--emit-text",
         "-S",
         "Emit text instead of binary for the output file",
         WasmMetaDCEOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { emitBinary = false; })
    .add("--debuginfo",
         "-g",
         "Emit names section and debug info",
         WasmMetaDCEOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& arguments) { debugInfo = true; })
    .add("--graph-file",
         "-f",
         "Filename of the graph description file",
         WasmMetaDCEOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { graphFile = argument; })
    .add("--dump",
         "-d",
         "Dump the combined graph file (useful for debugging)",
         WasmMetaDCEOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& arguments) { dump = true; })
    .add_positional("INFILE",
                    Options::Arguments::One,
                    [](Options* o, const std::string& argument) {
                      o->extra["infile"] = argument;
                    });
  options.parse(argc, argv);

  if (graphFile.size() == 0) {
    Fatal() << "no graph file provided.";
  }

  auto input(read_file<std::string>(options.extra["infile"], Flags::Text));

  Module wasm;
  options.applyFeatures(wasm);

  {
    if (options.debug) {
      std::cerr << "reading...\n";
    }
    ModuleReader reader;
    reader.setDWARF(debugInfo);
    try {
      reader.read(options.extra["infile"], wasm);
    } catch (ParseException& p) {
      p.dump(std::cerr);
      Fatal() << "error in parsing wasm input";
    }
  }

  if (options.passOptions.validate) {
    if (!WasmValidator().validate(wasm)) {
      std::cout << wasm << '\n';
      Fatal() << "error in validating input";
    }
  }

  auto graphInput(read_file<std::string>(graphFile, Flags::Text));
  auto* copy = strdup(graphInput.c_str());
  json::Value outside;
  outside.parse(copy);

  // parse the JSON into our graph, doing all the JSON parsing here, leaving
  // the abstract computation for the class itself
  const json::IString NAME("name");
  const json::IString REACHES("reaches");
  const json::IString ROOT("root");
  const json::IString EXPORT("export");
  const json::IString IMPORT("import");

  MetaDCEGraph graph(wasm);

  if (!outside.isArray()) {
    Fatal()
      << "input graph must be a JSON array of nodes. see --help for the form";
  }
  auto size = outside.size();
  for (size_t i = 0; i < size; i++) {
    json::Ref ref = outside[i];
    if (!ref->isObject()) {
      Fatal()
        << "nodes in input graph must be JSON objects. see --help for the form";
    }
    if (!ref->has(NAME)) {
      Fatal()
        << "nodes in input graph must have a name. see --help for the form";
    }
    DCENode node(ref[NAME]->getIString());
    if (ref->has(REACHES)) {
      json::Ref reaches = ref[REACHES];
      if (!reaches->isArray()) {
        Fatal() << "node.reaches must be an array. see --help for the form";
      }
      auto size = reaches->size();
      for (size_t j = 0; j < size; j++) {
        json::Ref name = reaches[j];
        if (!name->isString()) {
          Fatal()
            << "node.reaches items must be strings. see --help for the form";
        }
        node.reaches.push_back(name->getIString());
      }
    }
    if (ref->has(ROOT)) {
      json::Ref root = ref[ROOT];
      if (!root->isBool() || !root->getBool()) {
        Fatal()
          << "node.root, if it exists, must be true. see --help for the form";
      }
      graph.roots.insert(node.name);
    }
    if (ref->has(EXPORT)) {
      json::Ref exp = ref[EXPORT];
      if (!exp->isString()) {
        Fatal() << "node.export, if it exists, must be a string. see --help "
                   "for the form";
      }
      graph.exportToDCENode[exp->getIString()] = node.name;
      graph.DCENodeToExport[node.name] = exp->getIString();
    }
    if (ref->has(IMPORT)) {
      json::Ref imp = ref[IMPORT];
      if (!imp->isArray() || imp->size() != 2 || !imp[0]->isString() ||
          !imp[1]->isString()) {
        Fatal() << "node.import, if it exists, must be an array of two "
                   "strings. see --help for the form";
      }
      auto id = graph.getImportId(imp[0]->getIString(), imp[1]->getIString());
      graph.importIdToDCENode[id] = node.name;
    }
    // TODO: optimize this copy with a clever move
    graph.nodes[node.name] = node;
  }

  // The external graph is now populated. Scan the module
  graph.scanWebAssembly();

  // Debug dump the graph, if requested
  if (dump) {
    graph.dump();
  }

  // Perform the DCE
  graph.deadCodeElimination();

  // Apply to the wasm
  graph.apply();

  if (options.extra.count("output") > 0) {
    ModuleWriter writer;
    writer.setBinary(emitBinary);
    writer.setDebugInfo(debugInfo);
    writer.write(wasm, options.extra["output"]);
  }

  // Print out everything that we found is removable, the outside might use that
  graph.printAllUnused();

  // Clean up
  free(copy);
}